

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int accessPayload(BtCursor *pCur,u32 offset,u32 amt,uchar *pBuf,int eOp)

{
  ushort uVar1;
  uint uVar2;
  undefined4 uVar3;
  MemPage *pMVar4;
  BtShared *pBt;
  u8 *puVar5;
  Pager *pPVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  Pgno *pPVar11;
  undefined8 uVar12;
  sqlite3_io_methods *psVar13;
  long lVar14;
  sqlite3_file *psVar15;
  uint uVar16;
  ulong uVar17;
  u32 uVar18;
  uint uVar19;
  long in_FS_OFFSET;
  DbPage *pDbPage;
  uchar *local_60;
  DbPage *local_48;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pMVar4 = pCur->pPage;
  if (pCur->ix < pMVar4->nCell) {
    pBt = pCur->pBt;
    getCellInfo(pCur);
    puVar5 = (pCur->info).pPayload;
    uVar1 = (pCur->info).nLocal;
    uVar8 = (uint)uVar1;
    if ((ulong)(pBt->usableSize - uVar8) < (ulong)((long)puVar5 - (long)pMVar4->aData)) {
      uVar12 = 0x12877;
    }
    else {
      if (uVar8 < offset || uVar8 - offset == 0) {
        uVar17 = (ulong)(offset - uVar1);
        iVar9 = 0;
        local_60 = pBuf;
      }
      else {
        uVar18 = uVar8 - offset;
        if (offset + amt <= (uint)uVar1) {
          uVar18 = amt;
        }
        iVar9 = copyPayload(puVar5 + offset,pBuf,uVar18,eOp,pMVar4->pDbPage);
        local_60 = pBuf + (int)uVar18;
        amt = amt - uVar18;
        uVar17 = 0;
      }
      if ((iVar9 == 0) && (amt != 0)) {
        uVar8 = pBt->usableSize - 4;
        uVar1 = (pCur->info).nLocal;
        uVar19 = *(uint *)(puVar5 + uVar1);
        uVar19 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18
        ;
        local_3c = uVar19;
        if ((pCur->curFlags & 4) == 0) {
          uVar16 = (((pBt->usableSize - (uint)uVar1) + (pCur->info).nPayload) - 5) / uVar8;
          if ((pCur->aOverflow == (Pgno *)0x0) ||
             (iVar9 = (*sqlite3Config.m.xSize)(pCur->aOverflow), iVar9 < (int)(uVar16 * 4))) {
            if (sqlite3Config.xTestCallback != (_func_int_int *)0x0) {
              iVar10 = (*sqlite3Config.xTestCallback)(0x19d);
              iVar9 = 7;
              if (iVar10 != 0) goto LAB_0013fdc4;
            }
            pPVar11 = (Pgno *)sqlite3Realloc(pCur->aOverflow,(long)(int)(uVar16 * 2) << 2);
            if (pPVar11 == (Pgno *)0x0) {
              iVar9 = 7;
              goto LAB_0013fdc4;
            }
            pCur->aOverflow = pPVar11;
          }
          else {
            pPVar11 = pCur->aOverflow;
          }
          lVar14 = 0;
          memset(pPVar11,0,(long)(int)uVar16 << 2);
          pCur->curFlags = pCur->curFlags | 4;
        }
        else {
          uVar7 = uVar17 / uVar8;
          lVar14 = 0;
          if (pCur->aOverflow[uVar7] != 0) {
            lVar14 = (long)(int)uVar7;
            uVar19 = pCur->aOverflow[lVar14];
            uVar17 = uVar17 % (ulong)uVar8;
            local_3c = uVar19;
          }
        }
        if (uVar19 != 0) {
          lVar14 = lVar14 * 4;
          do {
            if (pBt->nPage < uVar19) {
              uVar12 = 0x128be;
              goto LAB_0013fdbd;
            }
            pPVar11 = pCur->aOverflow;
            *(uint *)((long)pPVar11 + lVar14) = uVar19;
            uVar16 = (uint)uVar17;
            if (uVar16 < uVar8) {
              uVar18 = uVar8 - uVar16;
              if (uVar16 + amt <= uVar8) {
                uVar18 = amt;
              }
              if (eOp == 0 && uVar16 == 0) {
                pPVar6 = pBt->pPager;
                psVar15 = pPVar6->fd;
                psVar13 = psVar15->pMethods;
                if ((psVar13 == (sqlite3_io_methods *)0x0) ||
                   (pPVar6->pPCache->pDirty != (PgHdr *)0x0)) goto LAB_0013ffe3;
                if (pPVar6->pWal != (Wal *)0x0) {
                  local_48 = (DbPage *)((ulong)local_48 & 0xffffffff00000000);
                  walFindFrame(pPVar6->pWal,uVar19,(u32 *)&local_48);
                  if ((int)local_48 != 0) goto LAB_0013ffe3;
                  psVar15 = pPVar6->fd;
                  psVar13 = psVar15->pMethods;
                }
                iVar9 = (*psVar13->xDeviceCharacteristics)(psVar15);
                if ((-1 < (short)iVar9) || (local_60 + -4 < pBuf)) goto LAB_0013ffe3;
                psVar15 = pBt->pPager->fd;
                uVar3 = *(undefined4 *)(local_60 + -4);
                iVar9 = (*psVar15->pMethods->xRead)
                                  (psVar15,local_60 + -4,uVar18 + 4,
                                   (ulong)(uVar19 - 1) * (ulong)pBt->pageSize);
                uVar19 = *(uint *)(local_60 + -4);
                local_3c = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                           uVar19 << 0x18;
                *(undefined4 *)(local_60 + -4) = uVar3;
LAB_00140099:
                uVar17 = 0;
              }
              else {
LAB_0013ffe3:
                local_48 = (DbPage *)&DAT_aaaaaaaaaaaaaaaa;
                iVar9 = (*pBt->pPager->xGet)(pBt->pPager,uVar19,&local_48,(uint)(eOp == 0) * 2);
                if (iVar9 == 0) {
                  uVar19 = *local_48->pData;
                  local_3c = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                             uVar19 << 0x18;
                  iVar9 = copyPayload((void *)((ulong)(uVar16 + 4) + (long)local_48->pData),local_60
                                      ,uVar18,eOp,local_48);
                  if (local_48 != (DbPage *)0x0) {
                    sqlite3PagerUnrefNotNull(local_48);
                  }
                  goto LAB_00140099;
                }
              }
              amt = amt - uVar18;
              if (amt == 0) goto LAB_0013fdc4;
              local_60 = local_60 + (int)uVar18;
            }
            else {
              uVar2 = *(uint *)((long)pPVar11 + lVar14 + 4);
              if (uVar2 == 0) {
                iVar9 = getOverflowPage(pBt,uVar19,(MemPage **)0x0,&local_3c);
              }
              else {
                iVar9 = 0;
                local_3c = uVar2;
              }
              uVar17 = (ulong)(uVar16 - uVar8);
            }
            if (iVar9 != 0) goto LAB_00140181;
            uVar19 = local_3c;
            lVar14 = lVar14 + 4;
          } while (local_3c != 0);
        }
        iVar9 = 0;
      }
LAB_00140181:
      if ((iVar9 != 0) || (amt == 0)) goto LAB_0013fdc4;
      uVar12 = 0x12912;
    }
  }
  else {
    uVar12 = 0x12868;
  }
LAB_0013fdbd:
  iVar9 = 0xb;
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar12,
              "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
LAB_0013fdc4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar9;
}

Assistant:

static int accessPayload(
  BtCursor *pCur,      /* Cursor pointing to entry to read from */
  u32 offset,          /* Begin reading this far into payload */
  u32 amt,             /* Read this many bytes */
  unsigned char *pBuf, /* Write the bytes into this buffer */
  int eOp              /* zero to read. non-zero to write. */
){
  unsigned char *aPayload;
  int rc = SQLITE_OK;
  int iIdx = 0;
  MemPage *pPage = pCur->pPage;               /* Btree page of current entry */
  BtShared *pBt = pCur->pBt;                  /* Btree this cursor belongs to */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
  unsigned char * const pBufStart = pBuf;     /* Start of original out buffer */
#endif

  assert( pPage );
  assert( eOp==0 || eOp==1 );
  assert( pCur->eState==CURSOR_VALID );
  if( pCur->ix>=pPage->nCell ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( cursorHoldsMutex(pCur) );

  getCellInfo(pCur);
  aPayload = pCur->info.pPayload;
  assert( offset+amt <= pCur->info.nPayload );

  assert( aPayload > pPage->aData );
  if( (uptr)(aPayload - pPage->aData) > (pBt->usableSize - pCur->info.nLocal) ){
    /* Trying to read or write past the end of the data is an error.  The
    ** conditional above is really:
    **    &aPayload[pCur->info.nLocal] > &pPage->aData[pBt->usableSize]
    ** but is recast into its current form to avoid integer overflow problems
    */
    return SQLITE_CORRUPT_PAGE(pPage);
  }

  /* Check if data must be read/written to/from the btree page itself. */
  if( offset<pCur->info.nLocal ){
    int a = amt;
    if( a+offset>pCur->info.nLocal ){
      a = pCur->info.nLocal - offset;
    }
    rc = copyPayload(&aPayload[offset], pBuf, a, eOp, pPage->pDbPage);
    offset = 0;
    pBuf += a;
    amt -= a;
  }else{
    offset -= pCur->info.nLocal;
  }


  if( rc==SQLITE_OK && amt>0 ){
    const u32 ovflSize = pBt->usableSize - 4;  /* Bytes content per ovfl page */
    Pgno nextPage;

    nextPage = get4byte(&aPayload[pCur->info.nLocal]);

    /* If the BtCursor.aOverflow[] has not been allocated, allocate it now.
    **
    ** The aOverflow[] array is sized at one entry for each overflow page
    ** in the overflow chain. The page number of the first overflow page is
    ** stored in aOverflow[0], etc. A value of 0 in the aOverflow[] array
    ** means "not yet known" (the cache is lazily populated).
    */
    if( (pCur->curFlags & BTCF_ValidOvfl)==0 ){
      int nOvfl = (pCur->info.nPayload-pCur->info.nLocal+ovflSize-1)/ovflSize;
      if( pCur->aOverflow==0
       || nOvfl*(int)sizeof(Pgno) > sqlite3MallocSize(pCur->aOverflow)
      ){
        Pgno *aNew;
        if( sqlite3FaultSim(413) ){
          aNew = 0;
        }else{
          aNew = (Pgno*)sqlite3Realloc(pCur->aOverflow, nOvfl*2*sizeof(Pgno));
        }
        if( aNew==0 ){
          return SQLITE_NOMEM_BKPT;
        }else{
          pCur->aOverflow = aNew;
        }
      }
      memset(pCur->aOverflow, 0, nOvfl*sizeof(Pgno));
      pCur->curFlags |= BTCF_ValidOvfl;
    }else{
      /* Sanity check the validity of the overflow page cache */
      assert( pCur->aOverflow[0]==nextPage
           || pCur->aOverflow[0]==0
           || CORRUPT_DB );
      assert( pCur->aOverflow[0]!=0 || pCur->aOverflow[offset/ovflSize]==0 );

      /* If the overflow page-list cache has been allocated and the
      ** entry for the first required overflow page is valid, skip
      ** directly to it.
      */
      if( pCur->aOverflow[offset/ovflSize] ){
        iIdx = (offset/ovflSize);
        nextPage = pCur->aOverflow[iIdx];
        offset = (offset%ovflSize);
      }
    }

    assert( rc==SQLITE_OK && amt>0 );
    while( nextPage ){
      /* If required, populate the overflow page-list cache. */
      if( nextPage > pBt->nPage ) return SQLITE_CORRUPT_BKPT;
      assert( pCur->aOverflow[iIdx]==0
              || pCur->aOverflow[iIdx]==nextPage
              || CORRUPT_DB );
      pCur->aOverflow[iIdx] = nextPage;

      if( offset>=ovflSize ){
        /* The only reason to read this page is to obtain the page
        ** number for the next page in the overflow chain. The page
        ** data is not required. So first try to lookup the overflow
        ** page-list cache, if any, then fall back to the getOverflowPage()
        ** function.
        */
        assert( pCur->curFlags & BTCF_ValidOvfl );
        assert( pCur->pBtree->db==pBt->db );
        if( pCur->aOverflow[iIdx+1] ){
          nextPage = pCur->aOverflow[iIdx+1];
        }else{
          rc = getOverflowPage(pBt, nextPage, 0, &nextPage);
        }
        offset -= ovflSize;
      }else{
        /* Need to read this page properly. It contains some of the
        ** range of data that is being read (eOp==0) or written (eOp!=0).
        */
        int a = amt;
        if( a + offset > ovflSize ){
          a = ovflSize - offset;
        }

#ifdef SQLITE_DIRECT_OVERFLOW_READ
        /* If all the following are true:
        **
        **   1) this is a read operation, and
        **   2) data is required from the start of this overflow page, and
        **   3) there are no dirty pages in the page-cache
        **   4) the database is file-backed, and
        **   5) the page is not in the WAL file
        **   6) at least 4 bytes have already been read into the output buffer
        **
        ** then data can be read directly from the database file into the
        ** output buffer, bypassing the page-cache altogether. This speeds
        ** up loading large records that span many overflow pages.
        */
        if( eOp==0                                             /* (1) */
         && offset==0                                          /* (2) */
         && sqlite3PagerDirectReadOk(pBt->pPager, nextPage)    /* (3,4,5) */
         && &pBuf[-4]>=pBufStart                               /* (6) */
        ){
          sqlite3_file *fd = sqlite3PagerFile(pBt->pPager);
          u8 aSave[4];
          u8 *aWrite = &pBuf[-4];
          assert( aWrite>=pBufStart );                         /* due to (6) */
          memcpy(aSave, aWrite, 4);
          rc = sqlite3OsRead(fd, aWrite, a+4, (i64)pBt->pageSize*(nextPage-1));
          nextPage = get4byte(aWrite);
          memcpy(aWrite, aSave, 4);
        }else
#endif

        {
          DbPage *pDbPage;
          rc = sqlite3PagerGet(pBt->pPager, nextPage, &pDbPage,
              (eOp==0 ? PAGER_GET_READONLY : 0)
          );
          if( rc==SQLITE_OK ){
            aPayload = sqlite3PagerGetData(pDbPage);
            nextPage = get4byte(aPayload);
            rc = copyPayload(&aPayload[offset+4], pBuf, a, eOp, pDbPage);
            sqlite3PagerUnref(pDbPage);
            offset = 0;
          }
        }
        amt -= a;
        if( amt==0 ) return rc;
        pBuf += a;
      }
      if( rc ) break;
      iIdx++;
    }
  }

  if( rc==SQLITE_OK && amt>0 ){
    /* Overflow chain ends prematurely */
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  return rc;
}